

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
* __thiscall
jessilib::
word_split_once<std::vector<wchar_t,std::allocator<wchar_t>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>
          (pair<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> begin,
          __normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> end,
          wchar_t in_whitespace)

{
  wchar_t wVar1;
  __normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> __first;
  pointer pwVar2;
  pointer pwVar3;
  allocator_type local_79;
  pointer local_78;
  pointer pwStack_70;
  pointer pwStack_68;
  pointer local_58;
  pointer pwStack_50;
  pointer local_48;
  pointer pwStack_40;
  pointer local_38;
  pointer pwStack_30;
  
  local_38 = (pointer)0x0;
  pwStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pwStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pwStack_50 = (pointer)0x0;
  if (this < begin._M_current) {
    do {
      wVar1 = (wchar_t)end._M_current;
      __first._M_current = (wchar_t *)this;
      if (*(wchar_t *)this != wVar1) break;
      this = this + 4;
      __first._M_current = (wchar_t *)this;
    } while (this != (jessilib *)begin._M_current);
    do {
      if (this == (jessilib *)begin._M_current) goto LAB_0040326c;
      if (*(wchar_t *)this == wVar1) {
        std::vector<wchar_t,std::allocator<wchar_t>>::
        vector<__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
                  ((vector<wchar_t,std::allocator<wchar_t>> *)&local_78,__first,
                   (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
                    )this,&local_79);
        pwVar2 = local_48;
        pwVar3 = local_58;
        local_58 = local_78;
        pwStack_50 = pwStack_70;
        local_48 = pwStack_68;
        local_78 = (pointer)0x0;
        pwStack_70 = (pointer)0x0;
        pwStack_68 = (pointer)0x0;
        if (pwVar3 != (pointer)0x0) {
          operator_delete(pwVar3,(long)pwVar2 - (long)pwVar3);
        }
        if (local_78 != (pointer)0x0) {
          operator_delete(local_78,(long)pwStack_68 - (long)local_78);
        }
        goto LAB_0040332b;
      }
      this = (jessilib *)((long)this + 4);
    } while( true );
  }
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  goto LAB_004033bf;
LAB_0040326c:
  std::vector<wchar_t,std::allocator<wchar_t>>::
  vector<__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
            ((vector<wchar_t,std::allocator<wchar_t>> *)&local_78,__first,begin,&local_79);
  pwVar2 = local_48;
  pwVar3 = local_58;
  local_58 = local_78;
  pwStack_50 = pwStack_70;
  local_48 = pwStack_68;
  goto LAB_0040336b;
  while (*(wchar_t *)this == wVar1) {
LAB_0040332b:
    this = (jessilib *)((long)this + 4);
    if (this == (jessilib *)begin._M_current) break;
  }
  std::vector<wchar_t,std::allocator<wchar_t>>::
  vector<__gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
            ((vector<wchar_t,std::allocator<wchar_t>> *)&local_78,
             (__normal_iterator<const_wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             this,begin,&local_79);
  pwVar2 = pwStack_30;
  pwVar3 = pwStack_40;
  pwStack_40 = local_78;
  local_38 = pwStack_70;
  pwStack_30 = pwStack_68;
LAB_0040336b:
  local_78 = (pointer)0x0;
  pwStack_70 = (pointer)0x0;
  pwStack_68 = (pointer)0x0;
  if (pwVar3 != (pointer)0x0) {
    operator_delete(pwVar3,(long)pwVar2 - (long)pwVar3);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)pwStack_68 - (long)local_78);
  }
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = local_58;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pwStack_50;
  (__return_storage_ptr__->first).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
LAB_004033bf:
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = pwStack_40;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38;
  (__return_storage_ptr__->second).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pwStack_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}